

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_IterMulti::_Run(_Test_IterMulti *this)

{
  DB *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator local_212;
  allocator local_211;
  string local_210;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [40];
  Comparator *pCStack_1c0;
  Iterator *iter;
  
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x33b);
  std::__cxx11::string::string((string *)&local_210,"a",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"va",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x33c);
  std::__cxx11::string::string((string *)&local_210,"b",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"vb",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x33d);
  std::__cxx11::string::string((string *)&local_210,"c",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"vc",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  pDVar1 = (this->super_DBTest).db_;
  pCStack_1c0 = (Comparator *)0x0;
  local_1e8._32_8_ = (SpecialEnv *)0x100;
  iVar2 = (*pDVar1->_vptr_DB[6])(pDVar1,local_1e8 + 0x20);
  iter = (Iterator *)CONCAT44(extraout_var,iVar2);
  (*iter->_vptr_Iterator[3])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x341);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x343);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x345);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x347);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[3])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x349);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x34b);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[4])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x34e);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x350);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x352);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x354);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[4])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x356);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x358);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  local_1e8._32_8_ = "";
  pCStack_1c0 = (Comparator *)0x0;
  (*iter->_vptr_Iterator[5])(iter,local_1e8 + 0x20);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x35b);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  local_1e8._32_8_ = "a";
  pCStack_1c0 = (Comparator *)0x1;
  (*iter->_vptr_Iterator[5])(iter,local_1e8 + 0x20);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x35d);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  local_1e8._32_8_ = "ax";
  pCStack_1c0 = (Comparator *)0x2;
  (*iter->_vptr_Iterator[5])(iter,local_1e8 + 0x20);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x35f);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  local_1e8._32_8_ = "b";
  pCStack_1c0 = (Comparator *)0x1;
  (*iter->_vptr_Iterator[5])(iter,local_1e8 + 0x20);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x361);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  local_1e8._32_8_ = "z";
  pCStack_1c0 = (Comparator *)0x1;
  (*iter->_vptr_Iterator[5])(iter,local_1e8 + 0x20);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x363);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[4])(iter);
  (*iter->_vptr_Iterator[7])(iter);
  (*iter->_vptr_Iterator[7])(iter);
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x36a);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[3])(iter);
  (*iter->_vptr_Iterator[6])(iter);
  (*iter->_vptr_Iterator[6])(iter);
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x371);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x374);
  std::__cxx11::string::string((string *)&local_210,"a",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"va2",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x375);
  std::__cxx11::string::string((string *)&local_210,"a2",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"va3",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x376);
  std::__cxx11::string::string((string *)&local_210,"b",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"vb2",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x377);
  std::__cxx11::string::string((string *)&local_210,"c",&local_211);
  std::__cxx11::string::string((string *)local_1e8,"vc2",&local_212);
  DBTest::Put((DBTest *)local_1f0,(string *)this,&local_210);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1f0);
  Status::~Status((Status *)local_1f0);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x378);
  std::__cxx11::string::string((string *)&local_210,"b",(allocator *)local_1f0);
  DBTest::Delete((DBTest *)local_1e8,(string *)this);
  test::Tester::IsOk((Tester *)(local_1e8 + 0x20),(Status *)local_1e8);
  Status::~Status((Status *)local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[3])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x37a);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x37c);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x37e);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[6])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x380);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[4])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x382);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"c->vc");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,900);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"b->vb");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x386);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[6]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [6])"a->va");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[7])(iter);
  test::Tester::Tester
            ((Tester *)(local_1e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x388);
  DBTest::IterStatus_abi_cxx11_(&local_210,&this->super_DBTest,iter);
  test::Tester::IsEq<std::__cxx11::string,char[10]>
            ((Tester *)(local_1e8 + 0x20),&local_210,(char (*) [10])"(invalid)");
  std::__cxx11::string::~string((string *)&local_210);
  test::Tester::~Tester((Tester *)(local_1e8 + 0x20));
  (*iter->_vptr_Iterator[1])(iter);
  return;
}

Assistant:

TEST(DBTest, IterMulti) {
  ASSERT_OK(Put("a", "va"));
  ASSERT_OK(Put("b", "vb"));
  ASSERT_OK(Put("c", "vc"));
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("a");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Seek("ax");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("b");
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Seek("z");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  // Switch from reverse to forward
  iter->SeekToLast();
  iter->Prev();
  iter->Prev();
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Switch from forward to reverse
  iter->SeekToFirst();
  iter->Next();
  iter->Next();
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");

  // Make sure iter stays at snapshot
  ASSERT_OK(Put("a", "va2"));
  ASSERT_OK(Put("a2", "va3"));
  ASSERT_OK(Put("b", "vb2"));
  ASSERT_OK(Put("c", "vc2"));
  ASSERT_OK(Delete("b"));
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "c->vc");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "b->vb");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}